

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void Catch::enforceNoDuplicateTestCases
               (vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *functions)

{
  TestCase *pTVar1;
  ostream *poVar2;
  runtime_error *this;
  TestCase *__v;
  pair<std::_Rb_tree_iterator<Catch::TestCase>,_bool> pVar3;
  ostringstream local_1f0 [8];
  ostringstream ss;
  undefined1 local_78 [8];
  set<Catch::TestCase,_std::less<Catch::TestCase>,_std::allocator<Catch::TestCase>_> seenFunctions;
  
  seenFunctions._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&seenFunctions;
  seenFunctions._M_t._M_impl._0_4_ = 0;
  seenFunctions._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  seenFunctions._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  seenFunctions._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  __v = (functions->super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>)._M_impl.
        super__Vector_impl_data._M_start;
  pTVar1 = (functions->super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  seenFunctions._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       seenFunctions._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  while( true ) {
    if (__v == pTVar1) {
      std::
      _Rb_tree<Catch::TestCase,_Catch::TestCase,_std::_Identity<Catch::TestCase>,_std::less<Catch::TestCase>,_std::allocator<Catch::TestCase>_>
      ::~_Rb_tree((_Rb_tree<Catch::TestCase,_Catch::TestCase,_std::_Identity<Catch::TestCase>,_std::less<Catch::TestCase>,_std::allocator<Catch::TestCase>_>
                   *)local_78);
      return;
    }
    pVar3 = std::
            _Rb_tree<Catch::TestCase,Catch::TestCase,std::_Identity<Catch::TestCase>,std::less<Catch::TestCase>,std::allocator<Catch::TestCase>>
            ::_M_insert_unique<Catch::TestCase_const&>
                      ((_Rb_tree<Catch::TestCase,Catch::TestCase,std::_Identity<Catch::TestCase>,std::less<Catch::TestCase>,std::allocator<Catch::TestCase>>
                        *)local_78,__v);
    if (((undefined1  [16])pVar3 & (undefined1  [16])0x1) == (undefined1  [16])0x0) break;
    __v = __v + 1;
  }
  std::__cxx11::ostringstream::ostringstream(local_1f0);
  seenFunctions._M_t._M_impl.super__Rb_tree_header._M_node_count._0_1_ = 0;
  Colour::use(Red);
  poVar2 = std::operator<<((ostream *)local_1f0,"error: TEST_CASE( \"");
  poVar2 = std::operator<<(poVar2,(string *)__v);
  poVar2 = std::operator<<(poVar2,"\" ) already defined.\n");
  poVar2 = std::operator<<(poVar2,"\tFirst seen at ");
  operator<<(poVar2,(SourceLineInfo *)(pVar3.first._M_node._M_node + 8));
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"\tRedefined at ");
  operator<<(poVar2,&(__v->super_TestCaseInfo).lineInfo);
  std::endl<char,std::char_traits<char>>(poVar2);
  Colour::~Colour((Colour *)&seenFunctions._M_t._M_impl.super__Rb_tree_header._M_node_count);
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::runtime_error::runtime_error
            (this,(string *)&seenFunctions._M_t._M_impl.super__Rb_tree_header._M_node_count);
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void enforceNoDuplicateTestCases( std::vector<TestCase> const& functions ) {
        std::set<TestCase> seenFunctions;
        for( std::vector<TestCase>::const_iterator it = functions.begin(), itEnd = functions.end();
            it != itEnd;
            ++it ) {
            std::pair<std::set<TestCase>::const_iterator, bool> prev = seenFunctions.insert( *it );
            if( !prev.second ) {
                std::ostringstream ss;

                ss  << Colour( Colour::Red )
                    << "error: TEST_CASE( \"" << it->name << "\" ) already defined.\n"
                    << "\tFirst seen at " << prev.first->getTestCaseInfo().lineInfo << "\n"
                    << "\tRedefined at " << it->getTestCaseInfo().lineInfo << std::endl;

                throw std::runtime_error(ss.str());
            }
        }
    }